

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

int64_t yactfr::internal::anon_unknown_0::readFlSIntBe42At4(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)((uint)buf[2] | (uint)buf[1] << 8 | (*buf & 0xf) << 0x10) << 0x16;
  uVar3 = ((uint)(buf[5] >> 2) | (uint)buf[4] << 6 | (uint)buf[3] << 0xe) | uVar2;
  uVar1 = uVar3 | 0xfffffc0000000000;
  if (uVar2 >> 0x29 == 0) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntBe42At4(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 6;
    res |= (buf[5] >> 2);
    res &= UINT64_C(0x3ffffffffff);

    if (res >> 41) {
        res |= UINT64_C(0xfffffc0000000000);
    }

    return static_cast<std::int64_t>(res);
}